

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O3

void sequential(fdb_kvs_handle *kv,int pos)

{
  char *__s;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  fdb_doc *doc;
  char keybuf [256];
  char bodybuf [512];
  char metabuf [256];
  fdb_doc *local_448;
  uint local_43c;
  char local_438 [256];
  char local_338 [776];
  
  uVar3 = (ulong)(uint)pos;
  local_448 = (fdb_doc *)0x0;
  uVar1 = 0;
  do {
    local_338[uVar1] =
         "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[uVar1 % 0x3e];
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x200);
  local_338[0x1ff] = 0;
  uVar1 = 0;
  local_43c = pos;
  do {
    sprintf(local_438,"%d_%dseqkey",uVar3,uVar1);
    __s = local_338 + 0x200;
    sprintf(__s,"meta%d",uVar1);
    keylen = strlen(local_438);
    metalen = strlen(__s);
    bodylen = strlen(local_338);
    fdb_doc_create(&local_448,local_438,keylen,__s,metalen,local_338,bodylen);
    fdb_set(kv,local_448);
    fdb_doc_free(local_448);
    uVar3 = (ulong)local_43c;
    uVar2 = (int)uVar1 + 1;
    uVar1 = (ulong)uVar2;
  } while (uVar2 != 1000);
  return;
}

Assistant:

void sequential(fdb_kvs_handle *kv, int pos) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[512];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 512);

    // load flat keys
    for (i = 0; i < 1000; i++){
        sprintf(keybuf, "%d_%dseqkey", pos, i);
        sprintf(metabuf, "meta%d", i);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    }
}